

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O0

void __thiscall deqp::egl::ApiCase::expectBoolean(ApiCase *this,EGLBoolean expected,EGLBoolean got)

{
  qpTestResult qVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1d8;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_2UL> local_1b8 [2];
  MessageBuilder local_198;
  EGLBoolean local_18;
  EGLBoolean local_14;
  EGLBoolean got_local;
  EGLBoolean expected_local;
  ApiCase *this_local;
  
  if (expected != got) {
    local_18 = got;
    local_14 = expected;
    _got_local = this;
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [20])"// ERROR expected: ");
    EVar3 = eglu::getBooleanStr(local_14);
    local_1c8 = EVar3.m_getName;
    local_1c0 = EVar3.m_value;
    local_1b8[0].m_getName = local_1c8;
    local_1b8[0].m_value = local_1c0;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [8])", Got: ");
    EVar3 = eglu::getBooleanStr(local_18);
    local_1d8.m_getName = EVar3.m_getName;
    local_1d8.m_value = EVar3.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d8);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid value");
    }
  }
  return;
}

Assistant:

void ApiCase::expectBoolean (EGLBoolean expected, EGLBoolean got)
{
	if (expected != got)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: " << eglu::getBooleanStr(expected) <<  ", Got: " << eglu::getBooleanStr(got) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}